

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

handle pybind11::detail::
       tuple_caster<std::tuple,Eigen::Array<double,-1,1,0,-1,1>,Eigen::Array<double,-1,1,0,-1,1>,Eigen::Array<double,-1,-1,0,-1,-1>,Eigen::Array<double,-1,-1,0,-1,-1>>
       ::
       cast_impl<std::tuple<Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,_1,0,_1,_1>,Eigen::Array<double,_1,_1,0,_1,_1>>,0ul,1ul,2ul,3ul>
                 (undefined8 *src,size_t param_2)

{
  undefined8 uVar1;
  Array<double,__1,_1,_0,__1,_1> *pAVar2;
  Array<double,__1,__1,_0,__1,__1> *pAVar3;
  long lVar4;
  handle hVar5;
  tuple result;
  array<pybind11::object,_4UL> entries;
  handle local_40;
  object local_38;
  PyObject *local_30;
  PyObject *local_28;
  PyObject *local_20;
  
  pAVar2 = (Array<double,__1,_1,_0,__1,_1> *)
           Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::operator_new
                     ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)0x10,param_2);
  (pAVar2->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
       (double *)src[8];
  (pAVar2->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = src[9];
  src[8] = 0;
  src[9] = 0;
  local_38.super_handle =
       eigen_encapsulate<pybind11::detail::EigenProps<Eigen::Array<double,_1,1,0,_1,1>>,Eigen::Array<double,_1,1,0,_1,1>,void>
                 (pAVar2);
  pAVar2 = (Array<double,__1,_1,_0,__1,_1> *)
           Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::operator_new
                     ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)0x10,param_2);
  (pAVar2->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
       (double *)src[6];
  (pAVar2->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = src[7];
  src[6] = 0;
  src[7] = 0;
  local_30 = (PyObject *)
             eigen_encapsulate<pybind11::detail::EigenProps<Eigen::Array<double,_1,1,0,_1,1>>,Eigen::Array<double,_1,1,0,_1,1>,void>
                       (pAVar2);
  pAVar3 = (Array<double,__1,__1,_0,__1,__1> *)
           Eigen::PlainObjectBase<Eigen::Array<double,-1,-1,0,-1,-1>>::operator_new
                     ((PlainObjectBase<Eigen::Array<double,_1,_1,0,_1,_1>> *)0x18,param_2);
  (pAVar3->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>).m_storage.m_data =
       (double *)src[3];
  (pAVar3->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows =
       src[4];
  (pAVar3->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols =
       src[5];
  src[3] = 0;
  src[4] = 0;
  src[5] = 0;
  local_28 = (PyObject *)
             eigen_encapsulate<pybind11::detail::EigenProps<Eigen::Array<double,_1,_1,0,_1,_1>>,Eigen::Array<double,_1,_1,0,_1,_1>,void>
                       (pAVar3);
  pAVar3 = (Array<double,__1,__1,_0,__1,__1> *)
           Eigen::PlainObjectBase<Eigen::Array<double,-1,-1,0,-1,-1>>::operator_new
                     ((PlainObjectBase<Eigen::Array<double,_1,_1,0,_1,_1>> *)0x18,param_2);
  (pAVar3->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>).m_storage.m_data =
       (double *)*src;
  (pAVar3->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows =
       src[1];
  (pAVar3->super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols =
       src[2];
  *src = 0;
  src[1] = 0;
  src[2] = 0;
  local_20 = (PyObject *)
             eigen_encapsulate<pybind11::detail::EigenProps<Eigen::Array<double,_1,_1,0,_1,_1>>,Eigen::Array<double,_1,_1,0,_1,_1>,void>
                       (pAVar3);
  hVar5.m_ptr = (PyObject *)0x0;
  lVar4 = 0;
  do {
    if (*(long *)((long)&local_38.super_handle.m_ptr + lVar4) == 0) goto LAB_0012db1d;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20);
  tuple::tuple((tuple *)&local_40,4);
  hVar5.m_ptr = local_40.m_ptr;
  lVar4 = 0;
  do {
    uVar1 = *(undefined8 *)((long)&local_38.super_handle.m_ptr + lVar4);
    *(undefined8 *)((long)&local_38.super_handle.m_ptr + lVar4) = 0;
    if (((local_40.m_ptr)->ob_type->tp_flags & 0x4000000) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/pybind11/include/pybind11/cast.h"
                    ,0x584,
                    "static handle pybind11::detail::tuple_caster<std::tuple, Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, -1>, Eigen::Array<double, -1, -1>>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::tuple, Ts = <Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, -1>, Eigen::Array<double, -1, -1>>, T = std::tuple<Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, -1>, Eigen::Array<double, -1, -1>>, Is = <0UL, 1UL, 2UL, 3UL>]"
                   );
    }
    *(undefined8 *)((long)&local_40.m_ptr[1].ob_type + lVar4) = uVar1;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20);
  local_40.m_ptr = (PyObject *)0x0;
  object::~object((object *)&local_40);
LAB_0012db1d:
  lVar4 = 0x18;
  do {
    object::~object((object *)((long)&local_38.super_handle.m_ptr + lVar4));
    lVar4 = lVar4 + -8;
  } while (lVar4 != -8);
  return (handle)hVar5.m_ptr;
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }